

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostasyn.c
# Opt level: O0

CURLcode Curl_addrinfo_callback(connectdata *conn,int status,Curl_addrinfo *ai)

{
  Curl_easy *data_00;
  Curl_easy *data;
  Curl_dns_entry *pCStack_28;
  CURLcode result;
  Curl_dns_entry *dns;
  Curl_addrinfo *ai_local;
  int status_local;
  connectdata *conn_local;
  
  pCStack_28 = (Curl_dns_entry *)0x0;
  data._4_4_ = CURLE_OK;
  (conn->async).status = status;
  if (status == 0) {
    if (ai == (Curl_addrinfo *)0x0) {
      data._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      data_00 = conn->data;
      if (data_00->share != (Curl_share *)0x0) {
        Curl_share_lock(data_00,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCStack_28 = Curl_cache_addr(data_00,ai,(conn->async).hostname,(conn->async).port);
      if (pCStack_28 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(ai);
        data._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      if (data_00->share != (Curl_share *)0x0) {
        Curl_share_unlock(data_00,CURL_LOCK_DATA_DNS);
      }
    }
  }
  (conn->async).dns = pCStack_28;
  (conn->async).done = true;
  return data._4_4_;
}

Assistant:

CURLcode Curl_addrinfo_callback(struct connectdata *conn,
                                int status,
                                struct Curl_addrinfo *ai)
{
  struct Curl_dns_entry *dns = NULL;
  CURLcode result = CURLE_OK;

  conn->async.status = status;

  if(CURL_ASYNC_SUCCESS == status) {
    if(ai) {
      struct Curl_easy *data = conn->data;

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      dns = Curl_cache_addr(data, ai,
                            conn->async.hostname,
                            conn->async.port);
      if(!dns) {
        /* failed to store, cleanup and return error */
        Curl_freeaddrinfo(ai);
        result = CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  conn->async.dns = dns;

 /* Set async.done TRUE last in this function since it may be used multi-
    threaded and once this is TRUE the other thread may read fields from the
    async struct */
  conn->async.done = TRUE;

  /* IPv4: The input hostent struct will be freed by ares when we return from
     this function */
  return result;
}